

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::HostAddress::Clear(HostAddress *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0xffffffff;
  in_RDI[1] = 0;
  memset(in_RDI + 2,0,0x10);
  std::__cxx11::string::clear();
  *(undefined1 *)(in_RDI + 0xe) = 1;
  return;
}

Assistant:

void HostAddress::Clear()
{

    m_protocol = HostAddress::UnknownNetworkProtocol;
    m_ip4Address = 0;
    memset(&m_ip6Address, 0, sizeof(IPv6Address));
    m_ipString.clear();

    // this may feel funny, but cleared IP (equivalent to '0.0.0.0') is technically valid
    // and that's not really what this flag is checking anyway
    //
    // this flag is false *iff* the string passed in is a 'plain-text' hostname (www.foo.bar)
    m_hasIpAddress = true;
}